

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O2

void http_dial_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,rv);
  }
  iVar1 = nni_list_empty((nni_list *)arg);
  if (iVar1 != 0) {
    nni_aio_abort((nni_aio *)((long)arg + 0x48),rv);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  return;
}

Assistant:

static void
http_dial_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_http_client *c = arg;
	nni_mtx_lock(&c->mtx);
	if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	if (nni_list_empty(&c->aios)) {
		nni_aio_abort(&c->aio, rv);
	}
	nni_mtx_unlock(&c->mtx);
}